

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_msg.c
# Opt level: O2

nng_err nni_http_res_parse(nng_http *conn,void *buf,size_t n,size_t *lenp)

{
  nng_err nVar1;
  nng_http_status status;
  char *pcVar2;
  char *pcVar3;
  size_t sVar4;
  size_t local_60;
  size_t cnt;
  size_t local_50;
  nng_http *local_48;
  size_t *local_40;
  nni_http_res *local_38;
  
  local_40 = lenp;
  local_38 = nni_http_conn_res(conn);
  sVar4 = 0;
  local_48 = conn;
LAB_00136623:
  while( true ) {
    nVar1 = http_scan_line(buf,n,&local_60);
    if (nVar1 != NNG_OK) goto LAB_00136718;
    sVar4 = sVar4 + local_60;
    if (*buf == '\0') {
      (local_38->data).parsed = false;
      nVar1 = NNG_OK;
      goto LAB_00136718;
    }
    pcVar2 = (char *)((long)buf + local_60);
    n = n - local_60;
    if ((local_38->data).parsed == false) break;
    nVar1 = http_parse_header(conn,buf);
    buf = pcVar2;
    if (nVar1 != NNG_OK) {
LAB_00136718:
      *local_40 = sVar4;
      return nVar1;
    }
  }
  cnt = (size_t)pcVar2;
  pcVar2 = strchr((char *)buf,0x20);
  if (pcVar2 != (char *)0x0) {
    *pcVar2 = '\0';
    local_50 = n;
    pcVar3 = strchr(pcVar2 + 1,0x20);
    if (pcVar3 != (char *)0x0) {
      *pcVar3 = '\0';
      status = atoi(pcVar2 + 1);
      conn = local_48;
      if (0xfffffc7b < status - 1000) {
        nni_http_set_status(local_48,status,pcVar3 + 1);
        nVar1 = nni_http_set_version(conn,(char *)buf);
        if (nVar1 != NNG_OK) goto LAB_00136718;
        (local_38->data).parsed = true;
        n = local_50;
        buf = (void *)cnt;
        goto LAB_00136623;
      }
    }
  }
  nVar1 = NNG_EPROTO;
  goto LAB_00136718;
}

Assistant:

nng_err
nni_http_res_parse(nng_http *conn, void *buf, size_t n, size_t *lenp)
{

	size_t        len = 0;
	size_t        cnt;
	int           rv  = 0;
	nng_http_res *res = nni_http_conn_res(conn);
	for (;;) {
		uint8_t *line;
		if ((rv = http_scan_line(buf, n, &cnt)) != 0) {
			break;
		}

		len += cnt;
		line = buf;
		buf  = line + cnt;
		n -= cnt;

		if (*line == '\0') {
			break;
		}

		if (res->data.parsed) {
			rv = http_parse_header(conn, line);
		} else if ((rv = http_res_parse_line(conn, line)) == 0) {
			res->data.parsed = true;
		}

		if (rv != 0) {
			break;
		}
	}

	if (rv == 0) {
		res->data.parsed = false;
	}
	*lenp = len;
	return (rv);
}